

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

Ptr __thiscall Polymer::FindBindingSite(Polymer *this,Ptr *pol,string *promoter_name)

{
  int iVar1;
  bool bVar2;
  __type _Var3;
  bool bVar4;
  int iVar5;
  FixedElement *pFVar6;
  element_type *peVar7;
  string *psVar8;
  runtime_error *prVar9;
  element_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_158 [8];
  string err_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  string err;
  Interval<std::shared_ptr<BindingSite>,_unsigned_long> *interval;
  iterator __end1;
  iterator __begin1;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  *__range1;
  undefined1 local_60 [8];
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  results;
  VecPtr promoter_choices;
  bool found;
  string *promoter_name_local;
  Ptr *pol_local;
  Polymer *this_local;
  Ptr *elem;
  
  bVar4 = false;
  std::vector<std::shared_ptr<BindingSite>,_std::allocator<std::shared_ptr<BindingSite>_>_>::vector
            ((vector<std::shared_ptr<BindingSite>,_std::allocator<std::shared_ptr<BindingSite>_>_> *
             )&results.
               super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::vector((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
            *)local_60);
  iVar1 = *(int *)&pol[8].super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
  iVar5 = MobileElement::start
                    ((MobileElement *)
                     &pol[0x1a].super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findOverlapping
            ((IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)
             &pol[0x14].super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (long)iVar1,(long)iVar5,(intervalVector *)local_60);
  __end1 = std::
           vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ::begin((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                    *)local_60);
  interval = (Interval<std::shared_ptr<BindingSite>,_unsigned_long> *)
             std::
             vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
             ::end((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                    *)local_60);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
                                     *)&interval), bVar2) {
    err.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
         ::operator*(&__end1);
    pFVar6 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&((reference)err.field_2._8_8_)->value)->super_FixedElement;
    psVar8 = FixedElement::name_abi_cxx11_(pFVar6);
    _Var3 = std::operator==(psVar8,in_RCX);
    if (_Var3) {
      pFVar6 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)(err.field_2._8_8_ + 0x10))->super_FixedElement;
      bVar2 = FixedElement::IsCovered(pFVar6);
      if (!bVar2) {
        std::vector<std::shared_ptr<BindingSite>,_std::allocator<std::shared_ptr<BindingSite>_>_>::
        push_back((vector<std::shared_ptr<BindingSite>,_std::allocator<std::shared_ptr<BindingSite>_>_>
                   *)&results.
                      super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (value_type *)(err.field_2._8_8_ + 0x10));
        bVar4 = true;
      }
    }
    __gnu_cxx::
    __normal_iterator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
    ::operator++(&__end1);
  }
  if (!bVar4) {
    peVar7 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)promoter_name);
    psVar8 = MobileElement::name_abi_cxx11_(peVar7);
    std::operator+(&local_130,"Polymerase ",psVar8);
    std::operator+(&local_110,&local_130," could not find free promoter ");
    std::operator+(&local_f0,&local_110,in_RCX);
    std::operator+(&local_d0,&local_f0," to bind in the polymer ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   &local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &pol[6].super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  );
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,(string *)local_b0);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  err_1.field_2._M_local_buf[0xf] = '\0';
  Random::WeightedChoice<std::shared_ptr<BindingSite>>
            ((Random *)this,
             (vector<std::shared_ptr<BindingSite>,_std::allocator<std::shared_ptr<BindingSite>_>_> *
             )&results.
               super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )this);
  peVar7 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)promoter_name);
  psVar8 = MobileElement::name_abi_cxx11_(peVar7);
  bVar4 = BindingSite::CheckInteraction(this_00,psVar8);
  if (!bVar4) {
    peVar7 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)promoter_name);
    psVar8 = MobileElement::name_abi_cxx11_(peVar7);
    std::operator+(&local_198,"Polymerase ",psVar8);
    std::operator+(&local_178,&local_198," does not interact with promoter ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   &local_178,in_RCX);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,(string *)local_158);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  err_1.field_2._M_local_buf[0xf] = '\x01';
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~vector((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
             *)local_60);
  std::vector<std::shared_ptr<BindingSite>,_std::allocator<std::shared_ptr<BindingSite>_>_>::~vector
            ((vector<std::shared_ptr<BindingSite>,_std::allocator<std::shared_ptr<BindingSite>_>_> *
             )&results.
               super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  PVar10.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar10.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Ptr)PVar10.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BindingSite::Ptr Polymer::FindBindingSite(MobileElement::Ptr pol,
                                          const std::string &promoter_name) {
  // Make a list of free promoters that pol can bind
  bool found = false;
  BindingSite::VecPtr promoter_choices;
  std::vector<Interval<BindingSite::Ptr>> results;
  binding_sites_.findOverlapping(start_, mask_.start(), results);
  for (auto &interval : results) {
    if (interval.value->name() == promoter_name &&
        !interval.value->IsCovered()) {
      promoter_choices.push_back(interval.value);
      found = true;
    }
  }
  // Error checking
  if (!found) {
    std::string err = "Polymerase " + pol->name() +
                      " could not find free promoter " + promoter_name +
                      " to bind in the polymer " + name_;
    throw std::runtime_error(err);
  }
  // Randomly select promoter.
  BindingSite::Ptr elem = Random::WeightedChoice(promoter_choices);
  // More error checking.
  if (!elem->CheckInteraction(pol->name())) {
    std::string err = "Polymerase " + pol->name() +
                      " does not interact with promoter " + promoter_name;
    throw std::runtime_error(err);
  }
  return elem;
}